

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::DiskLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,DiskLight *light,
               string *warn,string *err,PrimReconstructOptions *options)

{
  Property *prop;
  size_type *psVar1;
  _Base_ptr __k;
  size_type *psVar2;
  _Rb_tree_header *p_Var3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  long *plVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  Property *args;
  char *pcVar12;
  bool bVar13;
  char *pcVar14;
  string *psVar15;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  undefined1 local_308 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2f0;
  string local_2e0;
  string *local_2c0;
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_2b8;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_2b0;
  long *local_2a8 [2];
  long local_298 [2];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_258;
  string *local_250;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *local_248;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_240;
  _Base_ptr local_238;
  string local_230;
  string local_210;
  undefined1 local_1f0 [16];
  code *local_1e0;
  code *pcStack_1d8;
  ios_base local_180 [264];
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_288._M_t._M_impl.super__Rb_tree_header._M_header;
  local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar13 = false;
  local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_288._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar5 = ReconstructXformOpsFromProperties
                    (spec,&local_288,properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,err);
  if (bVar5) {
    p_Var11 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_238 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    bVar13 = true;
    if (p_Var11 != local_238) {
      local_240 = &light->radius;
      local_248 = &(light->super_BoundableLight).extent;
      local_258 = &(light->super_BoundableLight).props;
      local_2b8 = &(light->super_BoundableLight).purpose;
      local_2b0 = &(light->super_BoundableLight).visibility;
      local_2c0 = warn;
      local_250 = err;
      do {
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,*(long *)(p_Var11 + 1),
                   (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
        prop = (Property *)(p_Var11 + 2);
        local_1f0._0_8_ = &local_1e0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"inputs:radius","");
        psVar15 = (string *)local_1f0;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_308,&local_288,&local_210,prop,(string *)local_1f0,local_240
                  );
        if ((code **)local_1f0._0_8_ != &local_1e0) {
          operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        iVar6 = 0;
        if ((local_308._0_8_ & 0xfffffffd) == 0) {
          iVar6 = 3;
LAB_0020b30d:
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if (local_308._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1f0,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((string *)local_1f0,0xcd9);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            local_2a8[0] = local_298;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2a8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[14],std::__cxx11::string>
                      (&local_2e0,(fmt *)local_2a8,(string *)"inputs:radius",
                       (char (*) [14])(local_308 + 8),psVar15);
            poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1f0,local_2e0._M_dataplus._M_p,
                                local_2e0._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_2a8[0] != local_298) {
              operator_delete(local_2a8[0],local_298[0] + 1);
            }
            if (err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar8 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_2a8,(ulong)(err->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_2e0.field_2._M_allocated_capacity = *psVar1;
                local_2e0.field_2._8_8_ = plVar8[3];
                local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
              }
              else {
                local_2e0.field_2._M_allocated_capacity = *psVar1;
                local_2e0._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_2e0._M_string_length = plVar8[1];
              *plVar8 = (long)psVar1;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_2e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                operator_delete(local_2e0._M_dataplus._M_p,
                                local_2e0.field_2._M_allocated_capacity + 1);
              }
              if (local_2a8[0] != local_298) {
                operator_delete(local_2a8[0],local_298[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
            ::std::ios_base::~ios_base(local_180);
            iVar6 = 1;
            goto LAB_0020b30d;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._8_8_ != &aStack_2f0) {
          operator_delete((void *)local_308._8_8_,aStack_2f0._M_allocated_capacity + 1);
        }
        if (bVar5) {
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_230,*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          local_1f0._0_8_ = &local_1e0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"extent","");
          args = prop;
          anon_unknown_0::ParseExtentAttribute
                    ((ParseResult *)local_308,&local_288,&local_230,prop,(string *)local_1f0,
                     local_248);
          if ((code **)local_1f0._0_8_ != &local_1e0) {
            operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          iVar6 = 0;
          if ((local_308._0_8_ & 0xfffffffd) == 0) {
            iVar6 = 3;
LAB_0020b609:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (local_308._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1f0,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<((string *)local_1f0,0xcda);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              local_2a8[0] = local_298;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2a8,"Parsing attribute `extent` failed. Error: {}","");
              fmt::format<std::__cxx11::string>
                        ((string *)&local_2e0,(fmt *)local_2a8,(string *)(local_308 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1f0,local_2e0._M_dataplus._M_p,
                                  local_2e0._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                operator_delete(local_2e0._M_dataplus._M_p,
                                local_2e0.field_2._M_allocated_capacity + 1);
              }
              if (local_2a8[0] != local_298) {
                operator_delete(local_2a8[0],local_298[0] + 1);
              }
              if (err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar8 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_2a8,(ulong)(err->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_2e0.field_2._M_allocated_capacity = *psVar1;
                  local_2e0.field_2._8_8_ = plVar8[3];
                  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
                }
                else {
                  local_2e0.field_2._M_allocated_capacity = *psVar1;
                  local_2e0._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_2e0._M_string_length = plVar8[1];
                *plVar8 = (long)psVar1;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_2e0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                  operator_delete(local_2e0._M_dataplus._M_p,
                                  local_2e0.field_2._M_allocated_capacity + 1);
                }
                if (local_2a8[0] != local_298) {
                  operator_delete(local_2a8[0],local_298[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
              ::std::ios_base::~ios_base(local_180);
              iVar6 = 1;
              goto LAB_0020b609;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._8_8_ != &aStack_2f0) {
            operator_delete((void *)local_308._8_8_,aStack_2f0._M_allocated_capacity + 1);
          }
          if (!bVar5) goto LAB_0020c13e;
          __k = p_Var11 + 1;
          iVar6 = ::std::__cxx11::string::compare((char *)__k);
          if (iVar6 == 0) {
            local_1f0._0_8_ = &local_1e0;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"visibility","");
            cVar9 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_288,(string *)local_1f0);
            if ((code **)local_1f0._0_8_ != &local_1e0) {
              operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
            }
            if ((_Rb_tree_header *)cVar9._M_node == &local_288._M_t._M_impl.super__Rb_tree_header) {
              if (((ulong)p_Var11[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                Attribute::type_name_abi_cxx11_((string *)local_1f0,(Attribute *)prop);
                local_308._0_8_ = local_308 + 0x10;
                local_308._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x5;
                local_308._16_6_ = 0x6e656b6f74;
                if (((local_1f0._8_8_ == 5) &&
                    ((char)*(int *)(local_1f0._0_8_ + 4) == 'n' &&
                     *(int *)local_1f0._0_8_ == 0x656b6f74)) &&
                   (uVar4 = *(uint *)((long)&p_Var11[0x17]._M_parent + 4), uVar4 < 2)) {
                  if ((code **)local_1f0._0_8_ != &local_1e0) {
                    operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
                  }
                  if (uVar4 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1f0,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1f0,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1f0,"():",3);
                    poVar7 = (ostream *)::std::ostream::operator<<((string *)local_1f0,0xcdc);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1f0,"No value assigned to `",0x16);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1f0,"visibility",10);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1f0,"` token attribute. Set default token value.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1f0,"\n",1);
                    psVar15 = local_2c0;
                    if (local_2c0 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar8 = (long *)::std::__cxx11::string::_M_append
                                                 ((char *)&local_2e0,(ulong)(err->_M_dataplus)._M_p)
                      ;
                      psVar1 = (size_type *)(plVar8 + 2);
                      if ((size_type *)*plVar8 == psVar1) {
                        local_308._16_8_ = *psVar1;
                        aStack_2f0._M_allocated_capacity = plVar8[3];
                        local_308._0_8_ = local_308 + 0x10;
                      }
                      else {
                        local_308._16_8_ = *psVar1;
                        local_308._0_8_ = (size_type *)*plVar8;
                      }
                      local_308._8_8_ = plVar8[1];
                      *plVar8 = (long)psVar1;
                      plVar8[1] = 0;
                      *(undefined1 *)(plVar8 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)psVar15,(string *)local_308);
                      if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
                        operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                        operator_delete(local_2e0._M_dataplus._M_p,
                                        local_2e0.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
                    ::std::ios_base::~ios_base(local_180);
                    AttrMetas::operator=(&local_2b0->_metas,(AttrMetas *)(p_Var11 + 7));
                    pcVar14 = "visibility";
                    pcVar12 = "";
LAB_0020c29a:
                    local_1f0._0_8_ = &local_1e0;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f0,pcVar14,pcVar12);
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&local_288,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f0);
                    if ((code **)local_1f0._0_8_ != &local_1e0) {
                      operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
                    }
                    goto LAB_0020c14d;
                  }
                }
                else if ((code **)local_1f0._0_8_ != &local_1e0) {
                  operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
                }
              }
              local_308._0_8_ = local_308 + 0x10;
              local_1f0._8_8_ = 0;
              local_1f0._0_8_ = VisibilityEnumHandler;
              pcStack_1d8 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_invoke;
              local_1e0 = ::std::
                          _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          ::_M_manager;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"visibility","")
              ;
              bVar5 = options->strict_allowedToken_check;
              local_48 = (code *)0x0;
              pcStack_40 = (code *)0x0;
              local_58._M_unused._M_object = (void *)0x0;
              local_58._8_8_ = 0;
              if (local_1e0 != (code *)0x0) {
                (*local_1e0)(&local_58,(string *)local_1f0,2);
                local_48 = local_1e0;
                pcStack_40 = pcStack_1d8;
              }
              bVar5 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                ((string *)local_308,bVar5,
                                 (EnumHandlerFun<tinyusdz::Visibility> *)&local_58,(Attribute *)prop
                                 ,local_2b0,local_2c0,err);
              if (local_48 != (code *)0x0) {
                (*local_48)(&local_58,&local_58,__destroy_functor);
              }
              if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
                operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
              }
              iVar6 = 1;
              if (bVar5) {
                AttrMetas::operator=(&local_2b0->_metas,(AttrMetas *)(p_Var11 + 7));
                pcVar14 = "visibility";
                pcVar12 = "";
LAB_0020c0f2:
                local_308._0_8_ = local_308 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_308,pcVar14,pcVar12);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_288,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_308);
                if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
                  operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
                }
                iVar6 = 3;
              }
LAB_0020c124:
              if (local_1e0 != (code *)0x0) {
                (*local_1e0)(local_1f0,local_1f0,3);
              }
              goto LAB_0020c13e;
            }
          }
          else {
            iVar6 = ::std::__cxx11::string::compare((char *)__k);
            if (iVar6 == 0) {
              local_1f0._0_8_ = &local_1e0;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"purpose","");
              cVar9 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_288,(key_type *)local_1f0);
              if ((code **)local_1f0._0_8_ != &local_1e0) {
                operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
              }
              if ((_Rb_tree_header *)cVar9._M_node == &local_288._M_t._M_impl.super__Rb_tree_header)
              {
                if (((ulong)p_Var11[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                  Attribute::type_name_abi_cxx11_((string *)local_1f0,(Attribute *)prop);
                  local_308._0_8_ = local_308 + 0x10;
                  local_308._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x5;
                  local_308._16_6_ = 0x6e656b6f74;
                  if (((local_1f0._8_8_ == 5) &&
                      ((char)*(int *)(local_1f0._0_8_ + 4) == 'n' &&
                       *(int *)local_1f0._0_8_ == 0x656b6f74)) &&
                     (uVar4 = *(uint *)((long)&p_Var11[0x17]._M_parent + 4), uVar4 < 2)) {
                    if ((code **)local_1f0._0_8_ != &local_1e0) {
                      operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
                    }
                    if (uVar4 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,"():",3);
                      poVar7 = (ostream *)::std::ostream::operator<<((string *)local_1f0,0xcde);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,"No value assigned to `",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,"purpose",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,"` token attribute. Set default token value.",
                                 0x2b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,"\n",1);
                      psVar15 = local_2c0;
                      if (local_2c0 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_308,&local_2e0,err);
                        ::std::__cxx11::string::operator=((string *)psVar15,(string *)local_308);
                        if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
                          operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                          operator_delete(local_2e0._M_dataplus._M_p,
                                          local_2e0.field_2._M_allocated_capacity + 1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
                      ::std::ios_base::~ios_base(local_180);
                      AttrMetas::operator=(&local_2b8->_metas,(AttrMetas *)(p_Var11 + 7));
                      pcVar14 = "purpose";
                      pcVar12 = "";
                      goto LAB_0020c29a;
                    }
                  }
                  else if ((code **)local_1f0._0_8_ != &local_1e0) {
                    operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
                  }
                }
                local_308._0_8_ = local_308 + 0x10;
                local_1f0._8_8_ = 0;
                local_1f0._0_8_ = PurposeEnumHandler;
                pcStack_1d8 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_invoke;
                local_1e0 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_manager;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"purpose","");
                bVar5 = options->strict_allowedToken_check;
                local_68 = (code *)0x0;
                pcStack_60 = (code *)0x0;
                local_78._M_unused._M_object = (void *)0x0;
                local_78._8_8_ = 0;
                if (local_1e0 != (code *)0x0) {
                  (*local_1e0)(&local_78,(string *)local_1f0,2);
                  local_68 = local_1e0;
                  pcStack_60 = pcStack_1d8;
                }
                bVar5 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                  ((string *)local_308,bVar5,
                                   (EnumHandlerFun<tinyusdz::Purpose> *)&local_78,(Attribute *)prop,
                                   local_2b8,local_2c0,err);
                if (local_68 != (code *)0x0) {
                  (*local_68)(&local_78,&local_78,__destroy_functor);
                }
                if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
                  operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
                }
                iVar6 = 1;
                if (bVar5) {
                  AttrMetas::operator=(&local_2b8->_metas,(AttrMetas *)(p_Var11 + 7));
                  pcVar14 = "purpose";
                  pcVar12 = "";
                  goto LAB_0020c0f2;
                }
                goto LAB_0020c124;
              }
            }
            else {
              cVar9 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_288,(key_type *)__k);
              p_Var3 = &local_288._M_t._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)cVar9._M_node == p_Var3) {
                pmVar10 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                          ::operator[](local_258,(key_type *)__k);
                ::std::__cxx11::string::_M_assign((string *)pmVar10);
                (pmVar10->_attrib)._varying_authored = (bool)p_Var11[3].field_0x4;
                (pmVar10->_attrib)._variability = p_Var11[3]._M_color;
                ::std::__cxx11::string::_M_assign((string *)&(pmVar10->_attrib)._type_name);
                linb::any::operator=((any *)&(pmVar10->_attrib)._var,(any *)&p_Var11[4]._M_parent);
                (pmVar10->_attrib)._var._blocked = SUB41(p_Var11[5]._M_color,0);
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::operator=(&(pmVar10->_attrib)._var._ts._samples,
                            (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&p_Var11[5]._M_parent);
                (pmVar10->_attrib)._var._ts._dirty = SUB41(p_Var11[6]._M_color,0);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &(pmVar10->_attrib)._paths,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var11[6]._M_parent);
                AttrMetas::operator=(&(pmVar10->_attrib)._metas,(AttrMetas *)(p_Var11 + 7));
                *(_Base_ptr *)&pmVar10->_listOpQual = p_Var11[0x17]._M_parent;
                (pmVar10->_rel).type = *(Type *)&p_Var11[0x17]._M_left;
                Path::operator=(&(pmVar10->_rel).targetPath,(Path *)&p_Var11[0x17]._M_right);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &(pmVar10->_rel).targetPathVector,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var11[0x1e]._M_parent);
                (pmVar10->_rel).listOpQual = p_Var11[0x1f]._M_color;
                AttrMetas::operator=(&(pmVar10->_rel)._metas,(AttrMetas *)&p_Var11[0x1f]._M_parent);
                (pmVar10->_rel)._varying_authored = *(bool *)&p_Var11[0x2f]._M_left;
                ::std::__cxx11::string::_M_assign((string *)&pmVar10->_prop_value_type_name);
                pmVar10->_has_custom = *(bool *)&p_Var11[0x30]._M_right;
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_288,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
                ;
              }
              cVar9 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_288,(key_type *)__k);
              err = local_250;
              if ((_Rb_tree_header *)cVar9._M_node == p_Var3) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1f0,"[warn]",6);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1f0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1f0,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"():",3);
                poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1f0,0xce0);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_308,"Unsupported/unimplemented property: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__k);
                poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1f0,(char *)local_308._0_8_,local_308._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                psVar1 = (size_type *)(local_308 + 0x10);
                if ((size_type *)local_308._0_8_ != psVar1) {
                  operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
                }
                psVar15 = local_2c0;
                if (local_2c0 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar8 = (long *)::std::__cxx11::string::_M_append
                                             ((char *)&local_2e0,(ulong)(err->_M_dataplus)._M_p);
                  psVar2 = (size_type *)(plVar8 + 2);
                  if ((size_type *)*plVar8 == psVar2) {
                    local_308._16_8_ = *psVar2;
                    aStack_2f0._M_allocated_capacity = plVar8[3];
                    local_308._0_8_ = psVar1;
                  }
                  else {
                    local_308._16_8_ = *psVar2;
                    local_308._0_8_ = (size_type *)*plVar8;
                  }
                  local_308._8_8_ = plVar8[1];
                  *plVar8 = (long)psVar2;
                  plVar8[1] = 0;
                  *(undefined1 *)(plVar8 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)psVar15,(string *)local_308);
                  if ((size_type *)local_308._0_8_ != psVar1) {
                    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                    operator_delete(local_2e0._M_dataplus._M_p,
                                    local_2e0.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
                ::std::ios_base::~ios_base(local_180);
              }
            }
          }
        }
        else {
LAB_0020c13e:
          if ((iVar6 != 3) && (iVar6 != 0)) {
            bVar13 = false;
            goto LAB_0020c2db;
          }
        }
LAB_0020c14d:
        p_Var11 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var11);
      } while (p_Var11 != local_238);
      bVar13 = true;
    }
  }
LAB_0020c2db:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_288,
             (_Link_type)local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar13;
}

Assistant:

bool ReconstructPrim<DiskLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    DiskLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    // PARSE_PROPERTY(prop, "inputs:colorTemperature", light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:radius", DiskLight, light->radius)
    PARSE_EXTENT_ATTRIBUTE(table, prop, kExtent, DiskLight, light->extent)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, DiskLight,
                       light->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, DiskLight,
                       light->purpose, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, DiskLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}